

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  MetaCommandResult MVar1;
  PrepareResult PVar2;
  ExecuteResult EVar3;
  Table *this;
  ostream *poVar4;
  char *pcVar5;
  string local_118;
  string input;
  string local_d8;
  string local_b8;
  Statement st;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"2nd arg not provided.\n");
    return 1;
  }
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  this = (Table *)operator_new(0x10);
  Table::Table(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,argv[1],(allocator<char> *)&st);
  Table::dbOpen(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
LAB_00102793:
  while( true ) {
    std::operator<<((ostream *)&std::cout,"db > ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&input);
    if (*input._M_dataplus._M_p != '.') break;
    std::__cxx11::string::string((string *)&local_b8,(string *)&input);
    MVar1 = runCommand(&local_b8,this);
    std::__cxx11::string::~string((string *)&local_b8);
    if (MVar1 == CommandSuccess) break;
    std::operator<<((ostream *)&std::cout,"Unrecognized command!\n");
  }
  std::__cxx11::string::string((string *)&local_d8,(string *)&input);
  PVar2 = Statement::prepareStatement(&st,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  pcVar5 = "Syntax error. Could not parse statement.\n";
  switch(PVar2) {
  case PrepareUnrecognized:
    poVar4 = std::operator<<((ostream *)&std::cout,"Unrecognized Statement in ");
    poVar4 = std::operator<<(poVar4,(string *)&input);
    std::endl<char,std::char_traits<char>>(poVar4);
    goto LAB_00102793;
  case PrepareSyntaxError:
    break;
  case PrepareStringTooLong:
    pcVar5 = "String too long\n";
    break;
  case PrepareNegativeId:
    pcVar5 = "Negative Id not allowed!\n";
    break;
  default:
    EVar3 = Statement::executeStatement(&st,this);
    pcVar5 = "Executed\n";
    if (EVar3 != ExecuteSucess) {
      if (EVar3 != ExecuteDuplicateKey) goto LAB_00102793;
      pcVar5 = "Duplicate keys not allowed\n";
    }
  }
  std::operator<<((ostream *)&std::cout,pcVar5);
  goto LAB_00102793;
}

Assistant:

int main(int argc, char *argv[]) {
	if (argc < 2) {
		std::cout << "2nd arg not provided.\n";
		return 1;
	}
	std::string input;
	Table *table = new Table;
	table->dbOpen(argv[1]);

	while(true) {
		printPrompt();
		getline(std::cin, input);

		if (input[0] == '.') {
			switch(runCommand(input, table)) {
				case MetaCommandResult::CommandSuccess:
				break;
				case MetaCommandResult::CommandUnrecognized:
				std::cout << "Unrecognized command!\n";
                continue;
			}
		}

		Statement st;
		auto prepareResult = st.prepareStatement(input);
		switch(prepareResult) {
			case PrepareSuccess:
				break;
			case PrepareSyntaxError:
				std::cout << "Syntax error. Could not parse statement.\n";
                continue;
			case PrepareStringTooLong:
				std::cout << "String too long\n";
                continue;
			case PrepareNegativeId:
				std::cout << "Negative Id not allowed!\n";
				continue;
			case PrepareUnrecognized:
				std::cout << "Unrecognized Statement in " << input << std::endl;
				continue;
		}

		switch(st.executeStatement(table)) {
			case ExecuteSucess:
				std::cout << "Executed\n";
				break;
			case ExecuteDuplicateKey:
				std::cout << "Duplicate keys not allowed\n";
				break;
			case ExecuteTableFull:
				break;
		}
	}

	return 0;
}